

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

iterator * __thiscall
phmap::priv::
parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashMapPolicy<int,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,int>>>
::find<int,phmap::LockableBaseImpl<phmap::NullMutex>::DoNothing>
          (iterator *__return_storage_ptr__,
          parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashMapPolicy<int,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,int>>>
          *this,key_arg<int> *key,size_t hashval,DoNothing *mutexlock)

{
  EmbeddedSet *inner_00;
  size_t __n;
  iterator it;
  DoNothing local_39;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  *local_38;
  EmbeddedSet *set;
  Inner *inner;
  DoNothing *mutexlock_local;
  size_t hashval_local;
  key_arg<int> *key_local;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  *this_local;
  
  inner = (Inner *)mutexlock;
  mutexlock_local = (DoNothing *)hashval;
  hashval_local = (size_t)key;
  key_local = (key_arg<int> *)this;
  __n = parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
        ::subidx(hashval);
  local_38 = &std::
              array<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>::Inner,_16UL>
              ::operator[]((array<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>::Inner,_16UL>
                            *)this,__n)->set_;
  set = local_38;
  LockableBaseImpl<phmap::NullMutex>::DoNothing::
  DoNothing<phmap::priv::parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashMapPolicy<int,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,int>>>::Inner&>
            (&local_39,(Inner *)local_38);
  LockableBaseImpl<phmap::NullMutex>::DoNothing::operator=((DoNothing *)inner,&local_39);
  inner_00 = set;
  it = raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
       ::find<int>(local_38,(key_arg<int> *)hashval_local,(size_t)mutexlock_local);
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  ::make_iterator(__return_storage_ptr__,
                  (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
                   *)this,(Inner *)inner_00,it);
  return __return_storage_ptr__;
}

Assistant:

iterator find(const key_arg<K>& key, size_t hashval, L& mutexlock) {
        Inner& inner = sets_[subidx(hashval)];
        auto& set = inner.set_;
        mutexlock = std::move(L(inner));
        return make_iterator(&inner, set.find(key, hashval));
    }